

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O1

void normalizeLines(XML_Char *s)

{
  char *pcVar1;
  char *pcVar2;
  
  while( true ) {
    if (*s == '\0') {
      return;
    }
    pcVar1 = s;
    if (*s == '\r') break;
    s = s + 1;
  }
  do {
    if (*pcVar1 == '\r') {
      *s = '\n';
      if (pcVar1[1] == '\n') {
        pcVar2 = pcVar1 + 2;
      }
      else {
        pcVar2 = pcVar1 + 1;
      }
    }
    else {
      pcVar2 = pcVar1 + 1;
      *s = *pcVar1;
    }
    s = s + 1;
    pcVar1 = pcVar2;
  } while (*pcVar2 != '\0');
  *s = '\0';
  return;
}

Assistant:

static void FASTCALL
normalizeLines(XML_Char *s)
{
  XML_Char *p;
  for (;; s++) {
    if (*s == XML_T('\0'))
      return;
    if (*s == 0xD)
      break;
  }
  p = s;
  do {
    if (*s == 0xD) {
      *p++ = 0xA;
      if (*++s == 0xA)
        s++;
    }
    else
      *p++ = *s++;
  } while (*s);
  *p = XML_T('\0');
}